

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  RandomAccessFile **ppRVar1;
  bool bVar2;
  char *__file;
  int *piVar3;
  PosixRandomAccessFile *this_00;
  PosixMmapReadableFile *this_01;
  undefined8 *in_RCX;
  Status local_90;
  string local_88 [32];
  char *local_68;
  void *mmap_base;
  size_t local_58;
  uint64_t file_size;
  int local_2c;
  undefined8 *puStack_28;
  int fd;
  RandomAccessFile **result_local;
  string *filename_local;
  PosixEnv *this_local;
  Status *status;
  
  *in_RCX = 0;
  puStack_28 = in_RCX;
  result_local = result;
  filename_local = filename;
  this_local = this;
  __file = (char *)std::__cxx11::string::c_str();
  local_2c = open(__file,0x80000);
  ppRVar1 = result_local;
  if (local_2c < 0) {
    piVar3 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)ppRVar1,*piVar3);
  }
  else {
    bVar2 = Limiter::Acquire((Limiter *)(filename + 0x118));
    if (bVar2) {
      mmap_base._7_1_ = 0;
      (**(code **)(*(long *)filename + 0x68))(this,filename,result_local,&local_58);
      bVar2 = Status::ok((Status *)this);
      if (bVar2) {
        local_68 = (char *)mmap((void *)0x0,local_58,1,1,local_2c,0);
        ppRVar1 = result_local;
        if (local_68 == (char *)0xffffffffffffffff) {
          piVar3 = __errno_location();
          PosixError((anon_unknown_1 *)&local_90,(string *)ppRVar1,*piVar3);
          Status::operator=((Status *)this,&local_90);
          Status::~Status(&local_90);
        }
        else {
          this_01 = (PosixMmapReadableFile *)operator_new(0x40);
          std::__cxx11::string::string(local_88,(string *)result_local);
          PosixMmapReadableFile::PosixMmapReadableFile
                    (this_01,(string *)local_88,local_68,local_58,(Limiter *)(filename + 0x118));
          *puStack_28 = this_01;
          std::__cxx11::string::~string(local_88);
        }
      }
      close(local_2c);
      bVar2 = Status::ok((Status *)this);
      if (!bVar2) {
        Limiter::Release((Limiter *)(filename + 0x118));
      }
    }
    else {
      this_00 = (PosixRandomAccessFile *)operator_new(0x38);
      std::__cxx11::string::string((string *)&file_size,(string *)result_local);
      PosixRandomAccessFile::PosixRandomAccessFile
                (this_00,(string *)&file_size,local_2c,(Limiter *)(filename + 0x11c));
      *puStack_28 = this_00;
      std::__cxx11::string::~string((string *)&file_size);
      Status::OK();
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }